

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputSource.cc
# Opt level: O0

string * __thiscall
InputSource::readLine_abi_cxx11_
          (string *__return_storage_ptr__,InputSource *this,size_t max_line_length)

{
  size_t max_line_length_local;
  InputSource *this_local;
  
  read_line_abi_cxx11_(__return_storage_ptr__,this,max_line_length,-1);
  return __return_storage_ptr__;
}

Assistant:

std::string
InputSource::readLine(size_t max_line_length)
{
    return read_line(max_line_length);
}